

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRVersion.cpp
# Opt level: O3

Version * ZXing::QRCode::Version::Micro(int number)

{
  int iVar1;
  Version *pVVar2;
  long lVar3;
  int *piVar4;
  array<ZXing::QRCode::ECBlocks,_4UL> *paVar5;
  byte bVar6;
  array<ZXing::QRCode::ECBlocks,_4UL> local_160;
  array<ZXing::QRCode::ECBlocks,_4UL> local_110;
  array<ZXing::QRCode::ECBlocks,_4UL> local_c0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_70;
  
  bVar6 = 0;
  if (Micro(int)::allVersions == '\0') {
    iVar1 = __cxa_guard_acquire(&Micro(int)::allVersions);
    if (iVar1 != 0) {
      piVar4 = &DAT_0019f11c;
      paVar5 = &local_70;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Micro::allVersions,1,&local_70);
      piVar4 = &DAT_0019f16c;
      paVar5 = &local_c0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Micro::allVersions + 1,2,&local_c0);
      piVar4 = &DAT_0019f1bc;
      paVar5 = &local_110;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Micro::allVersions + 2,3,&local_110);
      piVar4 = &DAT_0019f20c;
      paVar5 = &local_160;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Micro::allVersions + 3,4,&local_160);
      __cxa_atexit(__cxx_global_array_dtor_64,0,&__dso_handle);
      __cxa_guard_release(&Micro(int)::allVersions);
    }
  }
  pVVar2 = (Version *)0x0;
  if (0xfffffffb < number - 5U) {
    pVVar2 = (Version *)
             &Model2::allVersions[(ulong)(uint)number + 0x27]._alignmentPatternCenters.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  }
  return pVVar2;
}

Assistant:

const Version* Version::Micro(int number)
{
	/**
	 * See ISO 18004:2006 6.5.1 Table 9
	 */
	static const Version allVersions[] = {
		{1, {2, 1, 3, 0, 0}},
		{2, {5, 1, 5, 0, 0, 6, 1, 4, 0, 0}},
		{3, {6, 1, 11, 0, 0, 8, 1, 9, 0, 0}},
		{4, {8, 1, 16, 0, 0, 10, 1, 14, 0, 0, 14, 1, 10, 0, 0}}};

	if (number < 1 || number > 4)
		return nullptr;
	return allVersions + number - 1;
}